

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)

{
  ulong uVar1;
  lhpage **pplVar2;
  int iVar3;
  lhpage *plVar4;
  sxu16 nByte;
  uint uVar5;
  sxu64 sVar6;
  undefined8 *in_R8;
  int iVar7;
  sxu16 iOfft;
  unqlite_page *pRaw;
  sxu16 local_56;
  uint local_54;
  undefined8 *local_50;
  lhpage **local_48;
  sxu16 *local_40;
  unqlite_page *local_38;
  
  local_50 = in_R8;
  local_48 = ppSlave;
  local_40 = pOfft;
  if (0 < *(int *)(nAmount + 0x58)) {
    plVar4 = *(lhpage **)(nAmount + 0x48);
    local_54 = (int)pOfft + 0x1a;
    uVar5 = local_54 & 0xffff;
    iVar7 = 0;
    do {
      iVar3 = lhAllocateSpace(plVar4,(ulong)uVar5,&local_56);
      if (iVar3 == 0) {
        nByte = (sxu16)local_54;
LAB_00114575:
        if (local_48 == (lhpage **)0x0) {
          lhRestoreSpace(plVar4,local_56,nByte);
        }
        else {
          *(sxu16 *)local_48 = local_56;
        }
        *local_50 = plVar4;
        return 0;
      }
      iVar3 = lhAllocateSpace(plVar4,0x1a,&local_56);
      if (iVar3 == 0) {
        nByte = 0x1a;
        goto LAB_00114575;
      }
      plVar4 = plVar4->pNextSlave;
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)(nAmount + 0x58));
  }
  iVar7 = lhAcquirePage((lhash_kv_engine *)pPage,&local_38);
  if (iVar7 == 0) {
    sVar6 = *(sxu64 *)(nAmount + 0x48);
    if (*(sxu64 *)(nAmount + 0x48) == 0) {
      sVar6 = nAmount;
    }
    plVar4 = lhNewPage((lhash_kv_engine *)pPage,local_38,(lhpage *)nAmount);
    if (plVar4 == (lhpage *)0x0) {
      iVar7 = -1;
    }
    else {
      iVar7 = lhSetEmptyPage(plVar4);
      pplVar2 = local_48;
      if (iVar7 == 0) {
        if (local_48 != (lhpage **)0x0) {
          iVar7 = lhAllocateSpace(plVar4,(sxu64)(local_40 + 0xd),&local_56);
          if (iVar7 != 0) {
            lhAllocateSpace(plVar4,0x1a,&local_56);
          }
          *(sxu16 *)pplVar2 = local_56;
        }
        iVar7 = (*(pPage->pHash->sAllocator).xMemError)(*(void **)(sVar6 + 8));
        if (iVar7 == 0) {
          uVar1 = local_38->iPage;
          *(ulong *)(**(long **)(sVar6 + 8) + 4) =
               uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          *(pgno *)(sVar6 + 0x18) = local_38->iPage;
          *local_50 = plVar4;
          return 0;
        }
      }
      (*(code *)(pPage->pHash->sAllocator).apPool[1])(plVar4->pRaw);
    }
  }
  return iVar7;
}

Assistant:

static int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	lhpage *pMaster = pPage->pMaster;
	lhpage *pSlave = pMaster->pSlave;
	unqlite_page *pRaw;
	lhpage *pNew;
	sxu16 iOfft;
	sxi32 i;
	int rc;
	/* Look for an already attached slave page */
	for( i = 0 ; i < pMaster->iSlave ; ++i ){
		/* Find a free chunk big enough */
		sxu16 size = (sxu16)(L_HASH_CELL_SZ + nAmount);
		rc = lhAllocateSpace(pSlave,size,&iOfft);
		if( rc != UNQLITE_OK ){
			/* A space for cell header only */
			size = L_HASH_CELL_SZ;
			rc = lhAllocateSpace(pSlave,size,&iOfft);
		}
		if( rc == UNQLITE_OK ){
			/* All done */
			if( pOfft ){
				*pOfft = iOfft;
			}else{
				rc = lhRestoreSpace(pSlave, iOfft, size);
			}
			*ppSlave = pSlave;
			return rc;
		}
		/* Point to the next slave page */
		pSlave = pSlave->pNextSlave;
	}
	/* Acquire a new slave page */
	rc = lhAcquirePage(pEngine,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Last slave page */
	pSlave = pMaster->pSlave;
	if( pSlave == 0 ){
		/* First slave page */
		pSlave = pMaster;
	}
	/* Initialize the page */
	pNew = lhNewPage(pEngine,pRaw,pMaster);
	if( pNew == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Mark as an empty page */
	rc = lhSetEmptyPage(pNew);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	if( pOfft ){
		/* Look for a free block */
		if( UNQLITE_OK != lhAllocateSpace(pNew,L_HASH_CELL_SZ+nAmount,&iOfft) ){
			/* Cell header only */
			lhAllocateSpace(pNew,L_HASH_CELL_SZ,&iOfft); /* Never fail */
		}	
		*pOfft = iOfft;
	}
	/* Link this page to the previous slave page */
	rc = pEngine->pIo->xWrite(pSlave->pRaw);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Reflect in the page header */
	SyBigEndianPack64(&pSlave->pRaw->zData[2/*Cell offset*/+2/*Free block offset*/],pRaw->iPage);
	pSlave->sHdr.iSlave = pRaw->iPage;
	/* All done */
	*ppSlave = pNew;
	return UNQLITE_OK;
fail:
	pEngine->pIo->xPageUnref(pNew->pRaw); /* pNew will be released in this call */
	return rc;

}